

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool updateAndroidManifest(Options *options)

{
  char16_t *pcVar1;
  QArrayData *pQVar2;
  qsizetype qVar3;
  QString *pQVar4;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  bool bVar8;
  FILE *__stream;
  char cVar9;
  bool bVar10;
  int iVar11;
  _Rb_tree_node_base *p_Var12;
  _Base_ptr p_Var13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long extraout_RDX;
  long extraout_RDX_00;
  _Base_ptr p_Var17;
  bool bVar18;
  _Rb_tree_header *p_Var19;
  long in_FS_OFFSET;
  QAnyStringView QVar20;
  QByteArrayView QVar21;
  QAnyStringView QVar22;
  QByteArrayView QVar23;
  QAnyStringView QVar24;
  QLatin1String QVar25;
  QAnyStringView QVar26;
  QAnyStringView QVar27;
  QAnyStringView QVar28;
  QAnyStringView QVar29;
  QAnyStringView QVar30;
  QLatin1String QVar31;
  QLatin1String QVar32;
  QAnyStringView QVar33;
  QStringView QVar34;
  QLatin1String QVar36;
  QLatin1String QVar37;
  QAnyStringView QVar38;
  QAnyStringView QVar39;
  QLatin1String QVar40;
  QLatin1String QVar41;
  QAnyStringView QVar42;
  QAnyStringView QVar43;
  QLatin1String QVar44;
  QStringView QVar45;
  QStringView QVar46;
  QStringView QVar47;
  QStringView QVar48;
  QStringView QVar49;
  QStringView QVar50;
  QStringView QVar51;
  undefined1 auVar52 [16];
  QXmlStreamReader reader_1;
  QXmlStreamReader reader;
  QMap<QString,_QString> resolvedPermissions;
  QArrayData *local_160;
  longlong local_158;
  QArrayData *local_148;
  undefined8 *local_140;
  undefined1 *local_130;
  QString local_128;
  QMap<QString,_QString> local_110;
  undefined1 *local_108;
  undefined1 *puStack_100;
  QString local_f8;
  QString local_d8;
  QHash<QString,_QString> local_c0;
  QStringBuilder<QString_&,_QLatin1String> local_b8;
  QArrayDataPointer<QXmlStreamAttribute> local_98;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 local_78;
  char16_t *pcStack_70;
  undefined8 local_68;
  QString local_58;
  long local_38;
  QAnyStringView QVar35;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (options->verbose == true) {
    fwrite("  -- AndroidManifest.xml \n",0x1a,1,_stdout);
  }
  local_c0.d = (Data *)0x0;
  local_d8.d.d = (Data *)0x0;
  local_d8.d.ptr = L"-- %%INSERT_APP_NAME%% --";
  local_d8.d.size = 0x19;
  QHash<QString,QString>::tryEmplace_impl<QString_const&>
            ((TryEmplaceResult *)&local_b8,(QHash<QString,QString> *)&local_c0,&local_d8);
  pcVar1 = local_b8.a[1].d.ptr;
  QString::operator=((QString *)
                     (*(long *)(pcVar1 + ((ulong)local_b8.b.m_size >> 7) * 0x48 + 0x40) + 0x18 +
                     (ulong)((uint)*(byte *)((long)pcVar1 +
                                            (ulong)((uint)local_b8.b.m_size & 0x7f) +
                                            ((ulong)local_b8.b.m_size >> 7) * 0x90) * 0x30)),
                     &options->appName);
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_d8.d.d = (Data *)0x0;
  local_d8.d.ptr = L"-- %%INSERT_APP_ARGUMENTS%% --";
  local_d8.d.size = 0x1e;
  QHash<QString,QString>::tryEmplace_impl<QString_const&>
            ((TryEmplaceResult *)&local_b8,(QHash<QString,QString> *)&local_c0,&local_d8);
  pcVar1 = local_b8.a[1].d.ptr;
  QString::operator=((QString *)
                     (*(long *)(pcVar1 + ((ulong)local_b8.b.m_size >> 7) * 0x48 + 0x40) + 0x18 +
                     (ulong)((uint)*(byte *)((long)pcVar1 +
                                            (ulong)((uint)local_b8.b.m_size & 0x7f) +
                                            ((ulong)local_b8.b.m_size >> 7) * 0x90) * 0x30)),
                     &options->applicationArguments);
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_d8.d.d = (Data *)0x0;
  local_d8.d.ptr = L"-- %%INSERT_APP_LIB_NAME%% --";
  local_d8.d.size = 0x1d;
  QHash<QString,QString>::tryEmplace_impl<QString_const&>
            ((TryEmplaceResult *)&local_b8,(QHash<QString,QString> *)&local_c0,&local_d8);
  pcVar1 = local_b8.a[1].d.ptr;
  QString::operator=((QString *)
                     (*(long *)(pcVar1 + ((ulong)local_b8.b.m_size >> 7) * 0x48 + 0x40) + 0x18 +
                     (ulong)((uint)*(byte *)((long)pcVar1 +
                                            (ulong)((uint)local_b8.b.m_size & 0x7f) +
                                            ((ulong)local_b8.b.m_size >> 7) * 0x90) * 0x30)),
                     &options->applicationBinary);
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_d8.d.d = (Data *)0x0;
  local_d8.d.ptr = L"-- %%INSERT_VERSION_NAME%% --";
  local_d8.d.size = 0x1d;
  QHash<QString,QString>::tryEmplace_impl<QString_const&>
            ((TryEmplaceResult *)&local_b8,(QHash<QString,QString> *)&local_c0,&local_d8);
  pcVar1 = local_b8.a[1].d.ptr;
  QString::operator=((QString *)
                     (*(long *)(pcVar1 + ((ulong)local_b8.b.m_size >> 7) * 0x48 + 0x40) + 0x18 +
                     (ulong)((uint)*(byte *)((long)pcVar1 +
                                            (ulong)((uint)local_b8.b.m_size & 0x7f) +
                                            ((ulong)local_b8.b.m_size >> 7) * 0x90) * 0x30)),
                     &options->versionName);
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_d8.d.d = (Data *)0x0;
  local_d8.d.ptr = L"-- %%INSERT_VERSION_CODE%% --";
  local_d8.d.size = 0x1d;
  QHash<QString,QString>::tryEmplace_impl<QString_const&>
            ((TryEmplaceResult *)&local_b8,(QHash<QString,QString> *)&local_c0,&local_d8);
  pcVar1 = local_b8.a[1].d.ptr;
  QString::operator=((QString *)
                     (*(long *)(pcVar1 + ((ulong)local_b8.b.m_size >> 7) * 0x48 + 0x40) + 0x18 +
                     (ulong)((uint)*(byte *)((long)pcVar1 +
                                            (ulong)((uint)local_b8.b.m_size & 0x7f) +
                                            ((ulong)local_b8.b.m_size >> 7) * 0x90) * 0x30)),
                     &options->versionCode);
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_b8.b.m_size = (qsizetype)(options->packageName).d.ptr;
  local_b8.b.m_data = (char *)((options->packageName).d.size | 0x8000000000000000);
  local_b8.a = (QString *)CONCAT71(local_b8.a._1_7_,1);
  local_58.d.ptr = (char16_t *)0x0;
  QVar20.m_size = (size_t)"package=\"%1\"";
  QVar20.field_0.m_data = &local_d8;
  local_58.d.d = (Data *)&local_b8;
  QtPrivate::argToQString(QVar20,0x400000000000000c,(ArgBase **)0x1);
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = L"package=\"org.qtproject.example\"";
  local_58.d.size = 0x1f;
  QHash<QString,QString>::tryEmplace_impl<QString_const&>
            ((TryEmplaceResult *)&local_b8,(QHash<QString,QString> *)&local_c0,&local_58);
  lVar16 = ((ulong)local_b8.b.m_size >> 7) * 0x90;
  lVar14 = *(long *)(*(long *)((long)local_b8.a + 0x20) + 0x80 + lVar16);
  uVar15 = (ulong)((uint)*(byte *)((ulong)((uint)local_b8.b.m_size & 0x7f) +
                                  *(long *)((long)local_b8.a + 0x20) + lVar16) * 0x30);
  pQVar2 = *(QArrayData **)(lVar14 + 0x18 + uVar15);
  *(Data **)(lVar14 + 0x18 + uVar15) = local_d8.d.d;
  pcVar1 = *(char16_t **)(lVar14 + 0x20 + uVar15);
  *(char16_t **)(lVar14 + 0x20 + uVar15) = local_d8.d.ptr;
  qVar3 = *(qsizetype *)(lVar14 + 0x28 + uVar15);
  *(qsizetype *)(lVar14 + 0x28 + uVar15) = local_d8.d.size;
  local_d8.d.d = (Data *)pQVar2;
  local_d8.d.ptr = pcVar1;
  local_d8.d.size = qVar3;
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_d8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QVar21.m_data = (storage_type_conflict *)0x11;
  QVar21.m_size = (qsizetype)&local_b8;
  QString::fromLatin1(QVar21);
  local_d8.d.d = (Data *)local_b8.a;
  local_d8.d.ptr = (char16_t *)local_b8.b.m_size;
  local_d8.d.size = (qsizetype)local_b8.b.m_data;
  lVar14 = (options->appIcon).d.size;
  if (lVar14 == 0) {
    QVar23.m_data = (storage_type_conflict *)0x0;
    QVar23.m_size = (qsizetype)&local_b8;
    QString::fromLatin1(QVar23);
    local_58.d.d = (Data *)local_b8.a;
    local_58.d.ptr = (char16_t *)local_b8.b.m_size;
    local_58.d.size = (qsizetype)local_b8.b.m_data;
  }
  else {
    QVar22.m_size = (size_t)&local_d8;
    QVar22.field_0.m_data = &local_58;
    QString::arg_impl(QVar22,(int)(options->appIcon).d.ptr,(QChar)(char16_t)lVar14);
  }
  QVar24.m_size = (size_t)&local_d8;
  QVar24.field_0.m_data = &local_f8;
  QString::arg_impl(QVar24,0x146a1b,(QChar)0x19);
  QHash<QString,QString>::tryEmplace_impl<QString_const&>
            ((TryEmplaceResult *)&local_b8,(QHash<QString,QString> *)&local_c0,&local_f8);
  lVar16 = ((ulong)local_b8.b.m_size >> 7) * 0x90;
  lVar14 = *(long *)(*(long *)((long)local_b8.a + 0x20) + 0x80 + lVar16);
  uVar15 = (ulong)((uint)*(byte *)((ulong)((uint)local_b8.b.m_size & 0x7f) +
                                  *(long *)((long)local_b8.a + 0x20) + lVar16) * 0x30);
  pQVar2 = *(QArrayData **)(lVar14 + 0x18 + uVar15);
  *(Data **)(lVar14 + 0x18 + uVar15) = local_58.d.d;
  pcVar1 = *(char16_t **)(lVar14 + 0x20 + uVar15);
  *(char16_t **)(lVar14 + 0x20 + uVar15) = local_58.d.ptr;
  qVar3 = *(qsizetype *)(lVar14 + 0x28 + uVar15);
  *(qsizetype *)(lVar14 + 0x28 + uVar15) = local_58.d.size;
  local_58.d.d = (Data *)pQVar2;
  local_58.d.ptr = pcVar1;
  local_58.d.size = qVar3;
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8.a = &options->outputDirectory;
  local_b8.b.m_size = 0x14;
  local_b8.b.m_data = "/AndroidManifest.xml";
  QStringBuilder<QString_&,_QLatin1String>::convertTo<QString>(&local_58,&local_b8);
  local_108 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_100 = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_108,&local_58);
  cVar9 = QFile::exists();
  if ((cVar9 != '\0') && (cVar9 = QFile::open(&local_108,1), cVar9 != '\0')) {
    local_128.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QXmlStreamReader::QXmlStreamReader((QXmlStreamReader *)&local_128,(QIODevice *)&local_108);
    cVar9 = QXmlStreamReader::atEnd();
    if (cVar9 == '\0') {
      do {
        QXmlStreamReader::readNext();
        iVar11 = QXmlStreamReader::tokenType();
        if (iVar11 == 4) {
          auVar52 = QXmlStreamReader::name();
          if ((auVar52._0_8_ == 0xf) &&
             (QVar25.m_data = "uses-permission", QVar25.m_size = 0xf, QVar34.m_data = auVar52._8_8_,
             QVar34.m_size = 0xf, cVar9 = QtPrivate::equalStrings(QVar25,QVar34), cVar9 != '\0')) {
            QXmlStreamReader::attributes();
            QVar26.m_size = (size_t)"android:name";
            QVar26.field_0.m_data = &local_f8;
            auVar52 = QXmlStreamAttributes::value(QVar26);
            QString::QString((QString *)&local_b8,auVar52._8_8_,auVar52._0_8_);
            QMap<QString,_QString>::remove(&options->modulePermissions,(char *)&local_b8);
            if ((QArrayData *)local_b8.a != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&(local_b8.a)->d)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&(local_b8.a)->d)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)&(local_b8.a)->d)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_b8.a,2,0x10);
              }
            }
            QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                      ((QArrayDataPointer<QXmlStreamAttribute> *)&local_f8);
            QXmlStreamReader::attributes();
            QVar27.m_size = (size_t)"android:name";
            QVar27.field_0.m_data = &local_f8;
            auVar52 = QXmlStreamAttributes::value(QVar27);
            QString::QString((QString *)&local_b8,auVar52._8_8_,auVar52._0_8_);
            QMap<QString,_QString>::remove(&options->applicationPermissions,(char *)&local_b8);
            if ((QArrayData *)local_b8.a != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)&(local_b8.a)->d)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)&(local_b8.a)->d)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)&(local_b8.a)->d)->_q_value).super___atomic_base<int>._M_i ==
                  0) {
                QArrayData::deallocate((QArrayData *)local_b8.a,2,0x10);
              }
            }
            QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                      ((QArrayDataPointer<QXmlStreamAttribute> *)&local_f8);
          }
        }
        cVar9 = QXmlStreamReader::atEnd();
      } while (cVar9 == '\0');
    }
    QFileDevice::close();
    QXmlStreamReader::~QXmlStreamReader((QXmlStreamReader *)&local_128);
  }
  local_110.d.d.ptr =
       (QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
        )(options->modulePermissions).d.d.ptr;
  if (local_110.d.d.ptr !=
      (totally_ordered_wrapper<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_*>
       )0x0) {
    LOCK();
    *(int *)local_110.d.d.ptr = *(int *)local_110.d.d.ptr + 1;
    UNLOCK();
  }
  QMap<QString,_QString>::detach(&options->applicationPermissions);
  p_Var12 = *(_Base_ptr *)
             ((long)&(((options->applicationPermissions).d.d.ptr)->m)._M_t._M_impl.
                     super__Rb_tree_header._M_header + 0x10);
  QMap<QString,_QString>::detach(&options->applicationPermissions);
  p_Var19 = &(((options->applicationPermissions).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var12 != p_Var19) {
    do {
      QMap<QString,_QString>::insert
                (&local_110,(QString *)(p_Var12 + 1),(QString *)&p_Var12[1]._M_right);
      p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
    } while ((_Rb_tree_header *)p_Var12 != p_Var19);
  }
  local_f8.d.d = (Data *)0x0;
  local_f8.d.ptr = (char16_t *)0x0;
  local_f8.d.size = 0;
  QMap<QString,_QString>::detach(&local_110);
  p_Var13 = *(_Base_ptr *)((long)local_110.d.d.ptr + 0x20);
  QMap<QString,_QString>::detach(&local_110);
  p_Var17 = (_Base_ptr)((long)local_110.d.d.ptr + 0x10);
  if (p_Var13 != p_Var17) {
    do {
      local_b8.b.m_size = (qsizetype)p_Var13[1]._M_parent;
      local_b8.b.m_data = (char *)((ulong)p_Var13[1]._M_left | 0x8000000000000000);
      local_b8.a = (QString *)CONCAT71(local_b8.a._1_7_,1);
      pcStack_70 = (char16_t *)0x0;
      QVar28.m_size = (size_t)"    <uses-permission android:name=\"%1\" %2 />\n";
      QVar28.field_0.m_data = &local_128;
      local_78.m_data = &local_b8;
      QtPrivate::argToQString(QVar28,0x400000000000002d,(ArgBase **)0x1);
      QVar29.m_size = (size_t)&local_128;
      QVar29.field_0.m_data = &local_b8;
      QString::arg_impl(QVar29,(int)*(undefined8 *)(p_Var13 + 2),
                        (QChar)(char16_t)p_Var13[2]._M_parent);
      QString::append(&local_f8);
      if ((QArrayData *)local_b8.a != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)&(local_b8.a)->d)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)&(local_b8.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)&(local_b8.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)local_b8.a,2,0x10);
        }
      }
      if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
        }
      }
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
    } while (p_Var13 != p_Var17);
  }
  QString::trimmed_helper(&local_128);
  local_78.m_data = (QArrayData *)0x0;
  pcStack_70 = L"<!-- %%INSERT_PERMISSIONS -->";
  local_68 = 0x1d;
  QHash<QString,QString>::tryEmplace_impl<QString_const&>
            ((TryEmplaceResult *)&local_b8,(QHash<QString,QString> *)&local_c0,(QString *)&local_78)
  ;
  lVar14 = *(long *)(*(char16_t **)((long)local_b8.a + 0x20) +
                    ((ulong)local_b8.b.m_size >> 7) * 0x48 + 0x40);
  uVar15 = (ulong)((uint)*(byte *)((long)*(char16_t **)((long)local_b8.a + 0x20) +
                                  (ulong)((uint)local_b8.b.m_size & 0x7f) +
                                  ((ulong)local_b8.b.m_size >> 7) * 0x90) * 0x30);
  pQVar2 = *(QArrayData **)(lVar14 + 0x18 + uVar15);
  *(Data **)(lVar14 + 0x18 + uVar15) = local_128.d.d;
  pcVar1 = *(char16_t **)(lVar14 + 0x20 + uVar15);
  *(char16_t **)(lVar14 + 0x20 + uVar15) = local_128.d.ptr;
  qVar3 = *(qsizetype *)(lVar14 + 0x28 + uVar15);
  *(qsizetype *)(lVar14 + 0x28 + uVar15) = local_128.d.size;
  local_128.d.d = (Data *)pQVar2;
  local_128.d.ptr = pcVar1;
  local_128.d.size = qVar3;
  if ((QArrayData *)local_78.m_data != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_78.m_data = *local_78.m_data + -1;
    UNLOCK();
    if (*local_78.m_data == 0) {
      QArrayData::deallocate((QArrayData *)local_78.m_data,2,0x10);
    }
  }
  if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_128.d.d = (Data *)0x0;
  local_128.d.ptr = (char16_t *)0x0;
  local_128.d.size = 0;
  lVar14 = (options->features).d.size;
  if (lVar14 != 0) {
    pQVar4 = (options->features).d.ptr;
    lVar16 = 0;
    do {
      local_b8.b.m_size = *(undefined8 *)((long)&(pQVar4->d).ptr + lVar16);
      local_b8.b.m_data =
           (char *)(*(ulong *)((long)&(pQVar4->d).size + lVar16) | 0x8000000000000000);
      local_b8.a = (QString *)CONCAT71(local_b8.a._1_7_,1);
      local_98.d = (Data *)&local_b8;
      local_98.ptr = (QXmlStreamAttribute *)0x0;
      QVar30.m_size =
           (size_t)"    <uses-feature android:name=\"%1\" android:required=\"false\" />\n";
      QVar30.field_0.m_data = &local_78;
      QtPrivate::argToQString(QVar30,0x4000000000000040,(ArgBase **)0x1);
      QString::append(&local_128);
      if ((QArrayData *)local_78.m_data != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_78.m_data = *local_78.m_data + -1;
        UNLOCK();
        if (*local_78.m_data == 0) {
          QArrayData::deallocate((QArrayData *)local_78.m_data,2,0x10);
        }
      }
      lVar16 = lVar16 + 0x18;
    } while (lVar14 * 0x18 != lVar16);
  }
  if (options->usesOpenGL != false) {
    QVar31.m_data = (char *)0x4d;
    QVar31.m_size = (qsizetype)&local_128;
    QString::append(QVar31);
  }
  QString::trimmed_helper((QString *)&local_78);
  local_98.d = (Data *)0x0;
  local_98.ptr = (QXmlStreamAttribute *)0x148bf6;
  local_98.size = 0x1a;
  QHash<QString,QString>::tryEmplace_impl<QString_const&>
            ((TryEmplaceResult *)&local_b8,(QHash<QString,QString> *)&local_c0,(QString *)&local_98)
  ;
  lVar14 = *(long *)(*(char16_t **)((long)local_b8.a + 0x20) +
                    ((ulong)local_b8.b.m_size >> 7) * 0x48 + 0x40);
  uVar15 = (ulong)((uint)*(byte *)((long)*(char16_t **)((long)local_b8.a + 0x20) +
                                  (ulong)((uint)local_b8.b.m_size & 0x7f) +
                                  ((ulong)local_b8.b.m_size >> 7) * 0x90) * 0x30);
  aVar5 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
          ((anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)(lVar14 + 0x18 + uVar15))->m_data;
  *(anon_union_8_3_8ad491a7_for_QAnyStringView_6 *)(lVar14 + 0x18 + uVar15) = local_78;
  uVar6 = *(undefined8 *)(lVar14 + 0x20 + uVar15);
  *(char16_t **)(lVar14 + 0x20 + uVar15) = pcStack_70;
  uVar7 = *(undefined8 *)(lVar14 + 0x28 + uVar15);
  *(undefined8 *)(lVar14 + 0x28 + uVar15) = local_68;
  local_78 = aVar5;
  pcStack_70 = (char16_t *)uVar6;
  local_68 = uVar7;
  if (&(local_98.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)local_78.m_data != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_78.m_data = *local_78.m_data + -1;
    UNLOCK();
    if (*local_78.m_data == 0) {
      QArrayData::deallocate((QArrayData *)local_78.m_data,2,0x10);
    }
  }
  bVar10 = updateFile(&local_58,&local_c0);
  if (bVar10) {
    cVar9 = QFile::exists();
    if (cVar9 == '\0') {
      updateAndroidManifest();
    }
    else {
      cVar9 = QFile::open(&local_108,1);
      if (cVar9 == '\0') {
        updateAndroidManifest();
      }
      else {
        local_130 = &DAT_aaaaaaaaaaaaaaaa;
        QXmlStreamReader::QXmlStreamReader((QXmlStreamReader *)&local_130,(QIODevice *)&local_108);
        cVar9 = QXmlStreamReader::atEnd();
        bVar10 = false;
        while (cVar9 == '\0') {
          QXmlStreamReader::readNext();
          iVar11 = QXmlStreamReader::tokenType();
          bVar18 = bVar10;
          if (iVar11 == 4) {
            auVar52 = QXmlStreamReader::name();
            if ((auVar52._0_8_ == 8) &&
               (QVar32.m_data = "uses-sdk", QVar32.m_size = 8, QVar45.m_data = auVar52._8_8_,
               QVar45.m_size = 8, cVar9 = QtPrivate::equalStrings(QVar32,QVar45), cVar9 != '\0')) {
              QXmlStreamReader::attributes();
              QVar33.m_size = (size_t)"android:minSdkVersion";
              QVar33.field_0.m_data = &local_b8;
              QXmlStreamAttributes::value(QVar33);
              QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                        ((QArrayDataPointer<QXmlStreamAttribute> *)&local_b8);
              if (extraout_RDX != 0) {
                QXmlStreamReader::attributes();
                QVar35.m_size = (size_t)"android:minSdkVersion";
                QVar35.field_0.m_data = &local_b8;
                QVar34 = (QStringView)QXmlStreamAttributes::value(QVar35);
                lVar14 = QString::toIntegral_helper(QVar34,(bool *)0x0,10);
                QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                          ((QArrayDataPointer<QXmlStreamAttribute> *)&local_b8);
                if (lVar14 - 0x80000000U < 0xffffffff8000001c) {
                  updateAndroidManifest();
                  goto LAB_0011b312;
                }
              }
            }
            else {
              auVar52 = QXmlStreamReader::name();
              if ((auVar52._0_8_ == 0xb) &&
                 (QVar36.m_data = "application", QVar36.m_size = 0xb, QVar46.m_data = auVar52._8_8_,
                 QVar46.m_size = 0xb, cVar9 = QtPrivate::equalStrings(QVar36,QVar46), cVar9 != '\0')
                 ) {
LAB_0011b011:
                QXmlStreamReader::attributes();
                QVar38.m_size = (size_t)"android:label";
                QVar38.field_0.m_data = &local_78;
                QXmlStreamAttributes::value(QVar38);
                if (extraout_RDX_00 == 0) {
                  bVar18 = true;
                  goto LAB_0011b081;
                }
                QXmlStreamReader::attributes();
                QVar39.m_size = (size_t)"android:label";
                QVar39.field_0.m_data = &local_98;
                auVar52 = QXmlStreamAttributes::value(QVar39);
                bVar18 = true;
                if (auVar52._0_8_ == 0x10) {
                  QVar40.m_data = "@string/app_name";
                  QVar40.m_size = 0x10;
                  QVar48.m_data = auVar52._8_8_;
                  QVar48.m_size = 0x10;
                  cVar9 = QtPrivate::equalStrings(QVar40,QVar48);
                }
                else {
                  cVar9 = '\0';
                }
                bVar8 = true;
              }
              else {
                auVar52 = QXmlStreamReader::name();
                if ((auVar52._0_8_ == 8) &&
                   (QVar37.m_data = "activity", QVar37.m_size = 8, QVar47.m_data = auVar52._8_8_,
                   QVar47.m_size = 8, cVar9 = QtPrivate::equalStrings(QVar37,QVar47), cVar9 != '\0')
                   ) goto LAB_0011b011;
                bVar18 = false;
LAB_0011b081:
                bVar8 = false;
                cVar9 = '\0';
              }
              if (bVar8) {
                QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_98);
              }
              if (bVar18) {
                QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                          ((QArrayDataPointer<QXmlStreamAttribute> *)&local_78);
              }
              bVar18 = true;
              if (cVar9 == '\0') {
                auVar52 = QXmlStreamReader::name();
                bVar18 = bVar10;
                if ((auVar52._0_8_ == 9) &&
                   (QVar41.m_data = "meta-data", QVar41.m_size = 9, QVar49.m_data = auVar52._8_8_,
                   QVar49.m_size = 9, cVar9 = QtPrivate::equalStrings(QVar41,QVar49), cVar9 != '\0')
                   ) {
                  QXmlStreamReader::attributes();
                  QVar42.m_size = (size_t)"android:name";
                  QVar42.field_0.m_data = &local_b8;
                  auVar52 = QXmlStreamAttributes::value(QVar42);
                  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                            ((QArrayDataPointer<QXmlStreamAttribute> *)&local_b8);
                  QXmlStreamReader::attributes();
                  QVar43.m_size = (size_t)"android:value";
                  QVar43.field_0.m_data = &local_b8;
                  QVar34 = (QStringView)QXmlStreamAttributes::value(QVar43);
                  QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer
                            ((QArrayDataPointer<QXmlStreamAttribute> *)&local_b8);
                  if ((auVar52._0_8_ == 0x14) &&
                     (QVar44.m_data = "android.app.lib_name", QVar44.m_size = 0x14,
                     QVar50.m_data = auVar52._8_8_, QVar50.m_size = 0x14,
                     cVar9 = QtPrivate::equalStrings(QVar44,QVar50), cVar9 != '\0')) {
                    local_b8.a = (QString *)CONCAT62(local_b8.a._2_6_,0x20);
                    QVar51.m_data = (storage_type *)&local_b8;
                    QVar51.m_size = 1;
                    lVar14 = QtPrivate::findString(QVar34,0,QVar51,CaseSensitive);
                    if (lVar14 != -1) {
                      updateAndroidManifest();
                      goto LAB_0011b312;
                    }
                  }
                }
              }
            }
          }
          cVar9 = QXmlStreamReader::atEnd();
          bVar10 = bVar18;
        }
        iVar11 = QXmlStreamReader::error();
        __stream = _stderr;
        if (iVar11 == 0) {
          QXmlStreamReader::~QXmlStreamReader((QXmlStreamReader *)&local_130);
          bVar18 = true;
          if (bVar10) {
            updateStringsXml(options);
          }
          goto LAB_0011b31e;
        }
        QString::toLocal8Bit_helper((QChar *)&local_b8,(longlong)local_58.d.ptr);
        p_Var13 = (_Base_ptr)local_b8.b.m_size;
        if ((_Base_ptr)local_b8.b.m_size == (_Base_ptr)0x0) {
          p_Var13 = (_Base_ptr)&QByteArray::_empty;
        }
        QXmlStreamReader::errorString();
        QString::toLocal8Bit_helper((QChar *)&local_148,local_158);
        if (local_140 == (undefined8 *)0x0) {
          local_140 = &QByteArray::_empty;
        }
        fprintf(__stream,"Error in %s: %s\n",p_Var13,local_140);
        if (local_148 != (QArrayData *)0x0) {
          LOCK();
          (local_148->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_148->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_148->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_148,1,0x10);
          }
        }
        if (local_160 != (QArrayData *)0x0) {
          LOCK();
          (local_160->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_160->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_160->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_160,2,0x10);
          }
        }
        if ((QArrayData *)local_b8.a != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&(local_b8.a)->d)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&(local_b8.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&(local_b8.a)->d)->_q_value).super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate((QArrayData *)local_b8.a,1,0x10);
          }
        }
LAB_0011b312:
        QXmlStreamReader::~QXmlStreamReader((QXmlStreamReader *)&local_130);
      }
    }
  }
  bVar18 = false;
LAB_0011b31e:
  if (&(local_128.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_128.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_128.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_f8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QString,_std::less<QString>,_std::allocator<std::pair<const_QString,_QString>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_110.d);
  QFile::~QFile((QFile *)&local_108);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QHash<QString,_QString>::~QHash(&local_c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar18;
  }
  __stack_chk_fail();
}

Assistant:

bool updateAndroidManifest(Options &options)
{
    if (options.verbose)
        fprintf(stdout, "  -- AndroidManifest.xml \n");

    QHash<QString, QString> replacements;
    replacements[QStringLiteral("-- %%INSERT_APP_NAME%% --")] = options.appName;
    replacements[QStringLiteral("-- %%INSERT_APP_ARGUMENTS%% --")] = options.applicationArguments;
    replacements[QStringLiteral("-- %%INSERT_APP_LIB_NAME%% --")] = options.applicationBinary;
    replacements[QStringLiteral("-- %%INSERT_VERSION_NAME%% --")] = options.versionName;
    replacements[QStringLiteral("-- %%INSERT_VERSION_CODE%% --")] = options.versionCode;
    replacements[QStringLiteral("package=\"org.qtproject.example\"")] = "package=\"%1\""_L1.arg(options.packageName);

    const QString iconAttribute = "android:icon=\"%1\""_L1;
    replacements[iconAttribute.arg("-- %%INSERT_APP_ICON%% --"_L1)] = options.appIcon.isEmpty() ?
            ""_L1 : iconAttribute.arg(options.appIcon);

    const QString androidManifestPath = options.outputDirectory + "/AndroidManifest.xml"_L1;
    QFile androidManifestXml(androidManifestPath);
    // User may have manually defined permissions in the AndroidManifest.xml
    // Read these permissions in order to remove any duplicates, as otherwise the
    // application build would fail.
    if (androidManifestXml.exists() && androidManifestXml.open(QIODevice::ReadOnly)) {
        QXmlStreamReader reader(&androidManifestXml);
        while (!reader.atEnd()) {
            reader.readNext();
            if (reader.isStartElement() && reader.name() == "uses-permission"_L1) {
                options.modulePermissions.remove(
                        QString(reader.attributes().value("android:name"_L1)));
                options.applicationPermissions.remove(
                        QString(reader.attributes().value("android:name"_L1)));
            }
        }
        androidManifestXml.close();
    }

    // Application may define permissions in its CMakeLists.txt, give them the priority
    QMap<QString, QString> resolvedPermissions = options.modulePermissions;
    for (auto [name, extras] : options.applicationPermissions.asKeyValueRange())
        resolvedPermissions.insert(name, extras);

    QString permissions;
    for (auto [name, extras] : resolvedPermissions.asKeyValueRange())
        permissions += "    <uses-permission android:name=\"%1\" %2 />\n"_L1.arg(name).arg(extras);
    replacements[QStringLiteral("<!-- %%INSERT_PERMISSIONS -->")] = permissions.trimmed();

    QString features;
    for (const QString &feature : std::as_const(options.features))
        features += "    <uses-feature android:name=\"%1\" android:required=\"false\" />\n"_L1.arg(feature);
    if (options.usesOpenGL)
        features += "    <uses-feature android:glEsVersion=\"0x00020000\" android:required=\"true\" />"_L1;

    replacements[QStringLiteral("<!-- %%INSERT_FEATURES -->")] = features.trimmed();

    if (!updateFile(androidManifestPath, replacements))
        return false;

    // read the package, min & target sdk API levels from manifest file.
    bool checkOldAndroidLabelString = false;
    if (androidManifestXml.exists()) {
        if (!androidManifestXml.open(QIODevice::ReadOnly)) {
            fprintf(stderr, "Cannot open %s for reading.\n", qPrintable(androidManifestPath));
            return false;
        }

        QXmlStreamReader reader(&androidManifestXml);
        while (!reader.atEnd()) {
            reader.readNext();

            if (reader.isStartElement()) {
                if (reader.name() == "uses-sdk"_L1) {
                    if (reader.attributes().hasAttribute("android:minSdkVersion"_L1))
                        if (reader.attributes().value("android:minSdkVersion"_L1).toInt() < 28) {
                            fprintf(stderr, "Invalid minSdkVersion version, minSdkVersion must be >= 28\n");
                            return false;
                        }
                } else if ((reader.name() == "application"_L1 ||
                            reader.name() == "activity"_L1) &&
                           reader.attributes().hasAttribute("android:label"_L1) &&
                           reader.attributes().value("android:label"_L1) == "@string/app_name"_L1) {
                    checkOldAndroidLabelString = true;
                } else if (reader.name() == "meta-data"_L1) {
                    const auto name = reader.attributes().value("android:name"_L1);
                    const auto value = reader.attributes().value("android:value"_L1);
                    if (name == "android.app.lib_name"_L1 && value.contains(u' ')) {
                        fprintf(stderr, "The Activity's android.app.lib_name should not contain"
                                        " spaces.\n");
                        return false;
                    }
                }
            }
        }

        if (reader.hasError()) {
            fprintf(stderr, "Error in %s: %s\n", qPrintable(androidManifestPath), qPrintable(reader.errorString()));
            return false;
        }
    } else {
        fprintf(stderr, "No android manifest file");
        return false;
    }

    if (checkOldAndroidLabelString)
        updateStringsXml(options);

    return true;
}